

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

_Bool prep_memory(Instance *instance)

{
  Vec2d *pVVar1;
  double *pdVar2;
  _Bool local_11;
  Instance *instance_local;
  
  pVVar1 = (Vec2d *)calloc((long)(instance->num_customers + 1),0x10);
  instance->positions = pVVar1;
  pdVar2 = (double *)calloc((long)(instance->num_customers + 1),8);
  instance->demands = pdVar2;
  pdVar2 = (double *)calloc((long)(instance->num_customers + 1),8);
  instance->profits = pdVar2;
  local_11 = false;
  if ((instance->positions != (Vec2d *)0x0) &&
     (local_11 = false, instance->demands != (double *)0x0)) {
    local_11 = instance->profits != (double *)0x0;
  }
  return local_11;
}

Assistant:

static bool prep_memory(Instance *instance) {

    instance->positions =
        calloc(instance->num_customers + 1, sizeof(*instance->positions));

    instance->demands =
        calloc(instance->num_customers + 1, sizeof(*instance->demands));

    instance->profits =
        calloc(instance->num_customers + 1, sizeof(*instance->profits));

    return instance->positions && instance->demands && instance->profits;
}